

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

void __thiscall jrtplib::RTCPScheduler::ScheduleBYEPacket(RTCPScheduler *this,size_t packetsize)

{
  bool bVar1;
  double dVar2;
  RTPTime RVar3;
  timespec tpMono;
  timespec tpMono_1;
  timespec local_38;
  timespec local_28;
  
  if (this->byescheduled == false) {
    if (this->firstcall == true) {
      this->firstcall = false;
      this->pmembers = this->sources->activecount;
    }
    this->byescheduled = true;
    this->avgbyepacketsize = packetsize + this->headeroverhead;
    this->byemembers = 1;
    this->pbyemembers = 1;
    if (((this->schedparams).immediatebye != true) ||
       (bVar1 = true, 0x31 < this->sources->activecount)) {
      bVar1 = false;
    }
    this->sendbyenow = bVar1;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_38);
      clock_gettime(1,&local_28);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar2 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
    }
    else {
      clock_gettime(1,&local_38);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    (this->prevrtcptime).m_t = dVar2;
    (this->nextrtcptime).m_t = dVar2;
    RVar3 = CalculateBYETransmissionInterval(this);
    (this->nextrtcptime).m_t = RVar3.m_t + (this->nextrtcptime).m_t;
  }
  return;
}

Assistant:

void RTCPScheduler::ScheduleBYEPacket(size_t packetsize)
{
	if (byescheduled)
		return;
	
	if (firstcall)
	{
		firstcall = false;
		pmembers = sources.GetActiveMemberCount();
	}

	byescheduled = true;
	avgbyepacketsize = packetsize+headeroverhead;

	// For now, we will always use the BYE backoff algorithm as described in rfc 3550 p 33
	
	byemembers = 1;
	pbyemembers = 1;

	if (schedparams.GetRequestImmediateBYE() && sources.GetActiveMemberCount() < 50) // p 34 (top)
		sendbyenow = true;
	else
		sendbyenow = false;
	
	prevrtcptime = RTPTime::CurrentTime();
	nextrtcptime = prevrtcptime;
	nextrtcptime += CalculateBYETransmissionInterval();
}